

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::EscapeOperator>>
               (string_t *ldata,string_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  undefined8 uVar3;
  undefined8 uVar4;
  string_t *psVar5;
  TemplatedValidityData<unsigned_long> *pTVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  unsigned_long uVar10;
  Vector *vector;
  ulong uVar11;
  ulong uVar12;
  string_t sVar13;
  Vector *vector_1;
  anon_union_16_2_67f50693_for_value local_78;
  ValidityMask *local_68;
  Vector *local_60;
  string_t *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  idx_t local_38;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  local_68 = mask;
  local_58 = ldata;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar7 = 8;
      do {
        puVar1 = (undefined8 *)((long)ldata + lVar7 + -8);
        local_78._0_8_ = *puVar1;
        local_78.pointer.ptr = (char *)puVar1[1];
        sVar13 = EscapeOperator::Operation<duckdb::string_t,duckdb::string_t>
                           ((string_t *)&local_78.pointer,(Vector *)dataptr);
        *(long *)((long)result_data + lVar7 + -8) = sVar13.value._0_8_;
        *(long *)((long)&result_data->value + lVar7) = sVar13.value._8_8_;
        lVar7 = lVar7 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78.pointer,(unsigned_long **)mask,&local_38);
      uVar4 = local_78.pointer.ptr;
      uVar3 = local_78._0_8_;
      local_78._0_8_ = 0;
      local_78.pointer.ptr = (char *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar3;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.pointer.ptr !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.pointer.ptr);
      }
      pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar6->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_50 = count + 0x3f >> 6;
      local_40 = 0;
      uVar11 = 0;
      local_60 = (Vector *)dataptr;
      local_48 = count;
      do {
        psVar5 = local_58;
        puVar2 = (local_68->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar2 == (unsigned_long *)0x0) {
          uVar10 = 0xffffffffffffffff;
        }
        else {
          uVar10 = puVar2[local_40];
        }
        uVar8 = uVar11 + 0x40;
        if (local_48 <= uVar11 + 0x40) {
          uVar8 = local_48;
        }
        uVar9 = uVar8;
        if (uVar10 != 0) {
          uVar9 = uVar11;
          if (uVar10 == 0xffffffffffffffff) {
            if (uVar11 < uVar8) {
              uVar12 = uVar11 << 4 | 8;
              do {
                puVar1 = (undefined8 *)((long)psVar5 + (uVar12 - 8));
                local_78._0_8_ = *puVar1;
                local_78.pointer.ptr = (char *)puVar1[1];
                sVar13 = EscapeOperator::Operation<duckdb::string_t,duckdb::string_t>
                                   ((string_t *)&local_78.pointer,(Vector *)dataptr);
                *(long *)((long)result_data + (uVar12 - 8)) = sVar13.value._0_8_;
                *(long *)((long)&result_data->value + uVar12) = sVar13.value._8_8_;
                uVar11 = uVar11 + 1;
                uVar12 = uVar12 + 0x10;
                uVar9 = uVar11;
              } while (uVar8 != uVar11);
            }
          }
          else {
            dataptr = local_60;
            if (uVar11 < uVar8) {
              uVar9 = uVar11 << 4 | 8;
              uVar12 = 0;
              do {
                if ((uVar10 >> (uVar12 & 0x3f) & 1) != 0) {
                  puVar1 = (undefined8 *)((long)local_58 + (uVar9 - 8));
                  local_78._0_8_ = *puVar1;
                  local_78.pointer.ptr = (char *)puVar1[1];
                  sVar13 = EscapeOperator::Operation<duckdb::string_t,duckdb::string_t>
                                     ((string_t *)&local_78.pointer,local_60);
                  *(long *)((long)result_data + (uVar9 - 8)) = sVar13.value._0_8_;
                  *(long *)((long)&result_data->value + uVar9) = sVar13.value._8_8_;
                }
                uVar12 = uVar12 + 1;
                uVar9 = uVar9 + 0x10;
              } while ((uVar11 - uVar8) + uVar12 != 0);
              dataptr = local_60;
              uVar9 = uVar11 + uVar12;
            }
          }
        }
        local_40 = local_40 + 1;
        uVar11 = uVar9;
      } while (local_40 != local_50);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}